

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall sptk::ScalarOperation::AddModuloOperation(ScalarOperation *this,double divisor)

{
  OperationInterface *operation;
  long in_RDI;
  double in_XMM0_Qa;
  OperationPerformer *this_00;
  undefined1 local_1;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    operation = (OperationInterface *)(in_RDI + 0x10);
    this_00 = (OperationPerformer *)0x10;
    operator_new(0x10);
    operator_new((ulong)this_00);
    anon_unknown.dwarf_5ae6::Modulo::Modulo((Modulo *)this_00,(double)operation);
    anon_unknown.dwarf_5ae6::OperationPerformer::OperationPerformer(this_00,operation);
    std::
    vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
    ::push_back((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                 *)this_00,(value_type *)operation);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ScalarOperation::AddModuloOperation(double divisor) {
  if (0 == divisor) return false;
  modules_.push_back(new OperationPerformer(new Modulo(divisor)));
  return true;
}